

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

void ixxx::posix::spawn_file_actions_adddup2(posix_spawn_file_actions_t *as,int oldfd,int newfd)

{
  int iVar1;
  spawn_file_actions_adddup2_error *this;
  int r;
  int newfd_local;
  int oldfd_local;
  posix_spawn_file_actions_t *as_local;
  
  iVar1 = posix_spawn_file_actions_adddup2((posix_spawn_file_actions_t *)as,oldfd,newfd);
  if (iVar1 != 0) {
    this = (spawn_file_actions_adddup2_error *)__cxa_allocate_exception(0x20);
    spawn_file_actions_adddup2_error::sys_error(this,iVar1,(char *)0x0,ERRNO);
    __cxa_throw(this,&spawn_file_actions_adddup2_error::typeinfo,
                spawn_file_actions_adddup2_error::~spawn_file_actions_adddup2_error);
  }
  return;
}

Assistant:

void spawn_file_actions_adddup2(posix_spawn_file_actions_t *as,
            int oldfd, int newfd)
    {
        int r = ::posix_spawn_file_actions_adddup2(as, oldfd, newfd);
        if (r)
            throw spawn_file_actions_adddup2_error(r);
    }